

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

double aom_noise_strength_lut_eval(aom_noise_strength_lut_t *lut,double x)

{
  double dVar1;
  double (*padVar2) [2];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  padVar2 = lut->points;
  if (x < (*padVar2)[0]) {
    return (*padVar2)[1];
  }
  uVar4 = (long)lut->num_points - 1;
  lVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar4) {
    uVar5 = uVar4 & 0xffffffff;
  }
  while( true ) {
    if (uVar5 * 0x10 == lVar3) {
      return padVar2[uVar4][1];
    }
    dVar6 = *(double *)((long)*padVar2 + lVar3);
    if ((dVar6 <= x) && (dVar1 = *(double *)((long)padVar2[1] + lVar3), x <= dVar1)) break;
    lVar3 = lVar3 + 0x10;
  }
  dVar6 = (x - dVar6) / (dVar1 - dVar6);
  return dVar6 * *(double *)((long)padVar2[1] + lVar3 + 8) +
         (1.0 - dVar6) * *(double *)((long)*padVar2 + lVar3 + 8);
}

Assistant:

double aom_noise_strength_lut_eval(const aom_noise_strength_lut_t *lut,
                                   double x) {
  int i = 0;
  // Constant extrapolation for x <  x_0.
  if (x < lut->points[0][0]) return lut->points[0][1];
  for (i = 0; i < lut->num_points - 1; ++i) {
    if (x >= lut->points[i][0] && x <= lut->points[i + 1][0]) {
      const double a =
          (x - lut->points[i][0]) / (lut->points[i + 1][0] - lut->points[i][0]);
      return lut->points[i + 1][1] * a + lut->points[i][1] * (1.0 - a);
    }
  }
  // Constant extrapolation for x > x_{n-1}
  return lut->points[lut->num_points - 1][1];
}